

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O1

int pull_by_re(char *input_file,char *aStrRegex,int min,int max,int length,int exclude,int convert,
              int just_count)

{
  kstring_t *str;
  size_t sVar1;
  int iVar2;
  gzFile pgVar3;
  kstream_t *pkVar4;
  uchar *puVar5;
  pcre2_code_8 *re;
  undefined8 extraout_RAX;
  char *pcVar6;
  ulong uVar7;
  size_t __size;
  kstring_t *str_00;
  undefined8 unaff_R12;
  uint uVar8;
  uint uVar9;
  char *unaff_R15;
  int errornumber;
  size_t erroroffset;
  PCRE2_UCHAR8 buffer [256];
  undefined8 uStackY_190;
  char *pcStackY_188;
  undefined8 uStackY_180;
  kseq_t *pkStackY_178;
  code *pcStackY_170;
  undefined1 local_14c [4];
  gzFile local_148;
  undefined1 local_140 [8];
  kstring_t local_138 [11];
  
  pcStackY_170 = (code *)0x10495b;
  pgVar3 = (gzFile)gzopen(input_file,"r");
  if (pgVar3 == (gzFile)0x0) {
    pcStackY_170 = (code *)0x104b85;
    pull_by_re_cold_3();
  }
  else {
    pcStackY_170 = (code *)0x104976;
    input_file = (char *)calloc(1,0x70);
    pcStackY_170 = (code *)0x104988;
    pkVar4 = (kstream_t *)calloc(1,0x20);
    pkVar4->f = pgVar3;
    pcStackY_170 = (code *)0x104999;
    puVar5 = (uchar *)malloc(0xffff);
    pkVar4->buf = puVar5;
    ((kseq_t *)input_file)->f = pkVar4;
    pcStackY_170 = (code *)0x1049a8;
    kseq_read((kseq_t *)input_file);
    unaff_R15 = (((kseq_t *)input_file)->qual).s;
    unaff_R12 = 0;
    pcStackY_170 = (code *)0x1049c4;
    local_148 = pgVar3;
    gzrewind(pgVar3);
    pkVar4 = ((kseq_t *)input_file)->f;
    pkVar4->begin = 0;
    pkVar4->end = 0;
    pkVar4->is_eof = 0;
    ((kseq_t *)input_file)->last_char = 0;
    if (verbose_flag != 0) {
      pcStackY_170 = (code *)0x104b78;
      pull_by_re_cold_1();
    }
    uVar8 = 0;
    pcStackY_170 = (code *)0x104a09;
    re = (pcre2_code_8 *)pcre2_compile_8(aStrRegex,0xffffffffffffffff,0,local_14c,local_140,0);
    if (re != (pcre2_code_8 *)0x0) {
      pcStackY_170 = (code *)0x104a1d;
      iVar2 = kseq_read((kseq_t *)input_file);
      uVar9 = 0;
      if (-1 < iVar2) {
        uVar9 = 0;
        uVar8 = 0;
        do {
          if (exclude == 0) {
            pcStackY_170 = (code *)0x104a6a;
            iVar2 = search_header(re,(((kseq_t *)input_file)->name).s);
            if (iVar2 == 0) {
              pcStackY_170 = (code *)0x104a7a;
              iVar2 = search_header(re,(((kseq_t *)input_file)->comment).s);
              if (iVar2 == 0) goto LAB_00104aad;
            }
LAB_00104a7e:
            pcStackY_170 = (code *)0x104aa8;
            iVar2 = size_filter((kseq_t *)input_file,(uint)(unaff_R15 == (char *)0x0),min,max,length
                                ,convert,just_count);
            uVar9 = uVar9 + iVar2;
          }
          else {
            pcStackY_170 = (code *)0x104a48;
            iVar2 = search_header(re,(((kseq_t *)input_file)->name).s);
            if (iVar2 == 0) {
              pcStackY_170 = (code *)0x104a58;
              iVar2 = search_header(re,(((kseq_t *)input_file)->comment).s);
              if (iVar2 == 0) goto LAB_00104a7e;
            }
LAB_00104aad:
            uVar8 = uVar8 + 1;
          }
          pcStackY_170 = (code *)0x104ab8;
          iVar2 = kseq_read((kseq_t *)input_file);
        } while (-1 < iVar2);
      }
      pcStackY_170 = (code *)0x104ac8;
      pcre2_code_free_8(re);
      if ((kseq_t *)input_file != (kseq_t *)0x0) {
        pcStackY_170 = (code *)0x104ad6;
        free((((kseq_t *)input_file)->name).s);
        pcStackY_170 = (code *)0x104adf;
        free((((kseq_t *)input_file)->comment).s);
        pcStackY_170 = (code *)0x104ae8;
        free((((kseq_t *)input_file)->seq).s);
        pcStackY_170 = (code *)0x104af1;
        free((((kseq_t *)input_file)->qual).s);
        pkVar4 = ((kseq_t *)input_file)->f;
        if (pkVar4 != (kstream_t *)0x0) {
          pcStackY_170 = (code *)0x104b02;
          free(pkVar4->buf);
          pcStackY_170 = (code *)0x104b0a;
          free(pkVar4);
        }
        pcStackY_170 = (code *)0x104b12;
        free(input_file);
      }
      pcStackY_170 = (code *)0x104b1c;
      gzclose(local_148);
      if (just_count != 0) {
        pcStackY_170 = (code *)0x104b41;
        fprintf(_stdout,"Total output: %i\n",(ulong)uVar9);
        pcStackY_170 = (code *)0x104b55;
        fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar8);
      }
      return uVar9;
    }
  }
  str_00 = local_138;
  pcStackY_170 = kseq_read;
  pull_by_re_cold_2();
  pkVar4 = (kstream_t *)str_00[4].m;
  uStackY_190 = extraout_RAX;
  pcStackY_188 = aStrRegex;
  uStackY_180 = unaff_R12;
  pkStackY_178 = (kseq_t *)input_file;
  pcStackY_170 = (code *)unaff_R15;
  if ((int)str_00[4].l == 0) {
    do {
      if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
        if (pkVar4->end <= pkVar4->begin) {
          pkVar4->begin = 0;
          iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
          pkVar4->end = iVar2;
          if (iVar2 == 0) {
            pkVar4->is_eof = 1;
            uVar8 = 0xffffffff;
            goto LAB_00104c22;
          }
        }
        iVar2 = pkVar4->begin;
        pkVar4->begin = iVar2 + 1;
        uVar8 = (uint)pkVar4->buf[iVar2];
      }
LAB_00104c22:
      uStackY_190 = CONCAT44(uVar8,(undefined4)uStackY_190);
      if (uVar8 == 0xffffffff) {
        return -1;
      }
    } while ((uVar8 != 0x40) && (uVar8 != 0x3e));
    *(uint *)&str_00[4].l = uVar8;
  }
  str_00[3].l = 0;
  str_00[2].l = 0;
  str_00[1].l = 0;
  iVar2 = ks_getuntil2(pkVar4,0,str_00,(int *)((long)&uStackY_190 + 4),0);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    if (uStackY_190._4_4_ != 10) {
      ks_getuntil2(pkVar4,2,str_00 + 1,(int *)0x0,0);
    }
    if (str_00[2].s == (char *)0x0) {
      str_00[2].m = 0x100;
      pcVar6 = (char *)malloc(0x100);
      str_00[2].s = pcVar6;
    }
    str = str_00 + 2;
LAB_00104ca0:
    if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
      if (pkVar4->end <= pkVar4->begin) {
        pkVar4->begin = 0;
        iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
        pkVar4->end = iVar2;
        if (iVar2 == 0) {
          pkVar4->is_eof = 1;
          uVar8 = 0xffffffff;
          goto LAB_00104cf3;
        }
      }
      iVar2 = pkVar4->begin;
      pkVar4->begin = iVar2 + 1;
      uVar8 = (uint)pkVar4->buf[iVar2];
    }
LAB_00104cf3:
    uStackY_190 = CONCAT44(uVar8,(undefined4)uStackY_190);
    if ((int)uVar8 < 0x2b) goto code_r0x00104cfc;
    if (uVar8 != 0x2b) {
      if ((uVar8 != 0x3e) && (uVar8 != 0x40)) goto LAB_00104d17;
      *(uint *)&str_00[4].l = uVar8;
    }
LAB_00104d63:
    uVar7 = str_00[2].l + 1;
    if (str_00[2].m <= uVar7) {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      __size = (uVar7 >> 0x10 | uVar7) + 1;
      str_00[2].m = __size;
      pcVar6 = (char *)realloc(str_00[2].s,__size);
      str_00[2].s = pcVar6;
    }
    str_00[2].s[str_00[2].l] = '\0';
    if (uStackY_190._4_4_ == 0x2b) {
      uVar7 = str_00[2].m;
      if (str_00[3].m < uVar7) {
        str_00[3].m = uVar7;
        pcVar6 = (char *)realloc(str_00[3].s,uVar7);
        str_00[3].s = pcVar6;
      }
      do {
        if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
          if (pkVar4->end <= pkVar4->begin) {
            pkVar4->begin = 0;
            iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
            pkVar4->end = iVar2;
            if (iVar2 == 0) {
              pkVar4->is_eof = 1;
              uVar8 = 0xffffffff;
              goto LAB_00104e4b;
            }
          }
          iVar2 = pkVar4->begin;
          pkVar4->begin = iVar2 + 1;
          uVar8 = (uint)pkVar4->buf[iVar2];
        }
LAB_00104e4b:
        uStackY_190 = CONCAT44(uVar8,(undefined4)uStackY_190);
        if (uVar8 == 0xffffffff) {
          return -2;
        }
      } while (uVar8 != 10);
      do {
        iVar2 = ks_getuntil2(pkVar4,2,str_00 + 3,(int *)0x0,1);
        if (iVar2 < 0) break;
      } while (str_00[3].l < str->l);
      *(undefined4 *)&str_00[4].l = 0;
      iVar2 = -2;
      if (str_00[2].l == str_00[3].l) {
        iVar2 = (int)str_00[2].l;
      }
    }
    else {
      iVar2 = (int)str->l;
    }
  }
  return iVar2;
code_r0x00104cfc:
  if (uVar8 != 10) {
    if (uVar8 == 0xffffffff) goto LAB_00104d63;
LAB_00104d17:
    sVar1 = str_00[2].l;
    str_00[2].l = sVar1 + 1;
    str_00[2].s[sVar1] = (char)uVar8;
    ks_getuntil2(pkVar4,2,str,(int *)0x0,1);
  }
  goto LAB_00104ca0;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}